

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O3

void __thiscall
QMetaObjectBuilderPrivate::~QMetaObjectBuilderPrivate(QMetaObjectBuilderPrivate *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  pDVar1 = (this->relatedMetaObjects).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->relatedMetaObjects).d.d)->super_QArrayData,8,0x10);
    }
  }
  std::vector<QMetaEnumBuilderPrivate,_std::allocator<QMetaEnumBuilderPrivate>_>::~vector
            (&this->enumerators);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&(this->classInfoValues).d);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&(this->classInfoNames).d);
  std::vector<QMetaPropertyBuilderPrivate,_std::allocator<QMetaPropertyBuilderPrivate>_>::~vector
            (&this->properties);
  std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::~vector
            (&this->constructors);
  std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::~vector
            (&this->methods);
  pDVar2 = (this->className).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> +
         -1);
    UNLOCK();
    if ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0)
    {
      QArrayData::deallocate(&((this->className).d.d)->super_QArrayData,1,0x10);
      return;
    }
  }
  return;
}

Assistant:

QMetaObjectBuilderPrivate()
        : flags(0)
    {
        superClass = &QObject::staticMetaObject;
        staticMetacallFunction = nullptr;
    }